

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_div_mips(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int32_t zExp;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  long lVar9;
  ulong uVar10;
  ulong a0;
  bool bVar11;
  bool bVar12;
  float128 fVar13;
  int32_t bExp;
  uint64_t term2;
  int32_t aExp;
  uint64_t term1;
  uint64_t term3;
  uint64_t term0;
  uint local_8c;
  ulong local_88;
  uint local_7c;
  float_status *local_78;
  ulong local_70;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  ulong local_38;
  
  local_68 = b.low;
  uVar2 = a.low;
  uVar7 = a.high & 0xffffffffffff;
  uVar5 = a.high._6_2_ & 0x7fff;
  local_60 = b.high & 0xffffffffffff;
  local_8c = b.high._6_2_ & 0x7fff;
  uVar6 = b.high ^ a.high;
  local_7c = uVar5;
  local_40 = uVar2;
  local_38 = uVar7;
  if (uVar5 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar2 != 0) {
LAB_0069c8a0:
      fVar13 = propagateFloat128NaN(a,b,status);
      return fVar13;
    }
    if (local_8c == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_68 == 0) {
LAB_0069cb18:
        status->float_exception_flags = status->float_exception_flags | 1;
        fVar13 = float128_default_nan_mips(status);
        return fVar13;
      }
      goto LAB_0069c8a0;
    }
LAB_0069cafa:
    uVar6 = uVar6 & 0x8000000000000000 | 0x7fff000000000000;
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_68 == 0) {
        if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0
            && uVar2 == 0) &&
            ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
        goto LAB_0069cb18;
        status->float_exception_flags = status->float_exception_flags | 4;
        goto LAB_0069cafa;
      }
      normalizeFloat128Subnormal(local_60,local_68,(int32_t *)&local_8c,&local_60,&local_68);
LAB_0069c8e5:
      local_78 = status;
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0) {
LAB_0069c93c:
        local_58 = uVar6 >> 0x3f;
        uVar10 = uVar2 << 0xf;
        uVar8 = uVar7 << 0xf | uVar2 >> 0x31 | 0x8000000000000000;
        uVar6 = local_68 * 0x8000;
        uVar7 = local_60 << 0xf | local_68 >> 0x31 | 0x8000000000000000;
        if ((uVar7 < uVar8) || (uVar6 <= uVar10 && uVar7 == uVar8)) {
          uVar8 = uVar8 >> 1;
          uVar10 = uVar10 >> 1 | (uVar2 >> 0x31) << 0x3f;
          zExp = (uVar5 - local_8c) + 0x3ffe;
        }
        else {
          zExp = (uVar5 - local_8c) + 0x3ffd;
        }
        uVar2 = estimateDiv128To64(uVar8,uVar10,uVar7);
        mul128By64To192(uVar7,uVar6,uVar2,&local_48,&local_70,&local_88);
        uVar3 = -local_88;
        a0 = (uVar10 - local_70) - (ulong)(local_88 != 0);
        for (lVar9 = ((uVar8 - local_48) - (ulong)(uVar10 < local_70)) -
                     (ulong)(uVar10 - local_70 < (ulong)(local_88 != 0)); lVar9 < 0;
            lVar9 = lVar9 + (ulong)(bVar12 || CARRY8(uVar10,(ulong)bVar11))) {
          uVar2 = uVar2 - 1;
          bVar11 = CARRY8(uVar3,uVar6);
          uVar3 = uVar3 + uVar6;
          bVar12 = CARRY8(a0,uVar7);
          uVar10 = a0 + uVar7;
          a0 = uVar10 + bVar11;
        }
        uVar8 = estimateDiv128To64(a0,uVar3,uVar7);
        if (((uint)uVar8 & 0x3fff) < 5) {
          mul128By64To192(uVar7,uVar6,uVar8,&local_70,&local_88,&local_50);
          uVar4 = (uVar3 - local_88) - (ulong)(local_50 != 0);
          uVar10 = -local_50;
          for (lVar9 = ((a0 - local_70) - (ulong)(uVar3 < local_88)) -
                       (ulong)(uVar3 - local_88 < (ulong)(local_50 != 0)); lVar9 < 0;
              lVar9 = lVar9 + (ulong)(bVar12 || CARRY8(uVar3,(ulong)bVar11))) {
            uVar8 = uVar8 - 1;
            bVar11 = CARRY8(uVar10,uVar6);
            uVar10 = uVar10 + uVar6;
            bVar12 = CARRY8(uVar4,uVar7);
            uVar3 = uVar4 + uVar7;
            uVar4 = uVar3 + bVar11;
          }
          uVar8 = uVar8 | ((uVar4 != 0 || lVar9 != 0) || uVar10 != 0);
        }
        fVar13 = roundAndPackFloat128
                           ((flag)local_58,zExp,uVar2 >> 0xf,uVar2 << 0x31 | uVar8 >> 0xf,
                            uVar8 << 0x31,local_78);
        return fVar13;
      }
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          uVar2 != 0) {
        normalizeFloat128Subnormal(uVar7,uVar2,(int32_t *)&local_7c,&local_38,&local_40);
        uVar2 = local_40;
        uVar7 = local_38;
        uVar5 = local_7c;
        goto LAB_0069c93c;
      }
    }
    else {
      if (local_8c != 0x7fff) goto LAB_0069c8e5;
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          local_68 != 0) goto LAB_0069c8a0;
    }
    uVar6 = uVar6 & 0x8000000000000000;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  return (float128)(auVar1 << 0x40);
}

Assistant:

float128 float128_div(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign, 0, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
            if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return float128_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = aExp - bExp + 0x3FFD;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000), aSig1, 15, &aSig0, &aSig1 );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    if ( le128( bSig0, bSig1, aSig0, aSig1 ) ) {
        shift128Right( aSig0, aSig1, 1, &aSig0, &aSig1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig0, aSig1, bSig0 );
    mul128By64To192( bSig0, bSig1, zSig0, &term0, &term1, &term2 );
    sub192( aSig0, aSig1, 0, term0, term1, term2, &rem0, &rem1, &rem2 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add192( rem0, rem1, rem2, 0, bSig0, bSig1, &rem0, &rem1, &rem2 );
    }
    zSig1 = estimateDiv128To64( rem1, rem2, bSig0 );
    if ( ( zSig1 & 0x3FFF ) <= 4 ) {
        mul128By64To192( bSig0, bSig1, zSig1, &term1, &term2, &term3 );
        sub192( rem1, rem2, 0, term1, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add192( rem1, rem2, rem3, 0, bSig0, bSig1, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 15, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}